

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O3

void __thiscall
crunch::print_texture_info
          (crunch *this,char *pTex_desc,convert_params *params,mipmapped_texture *tex)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  component_flags cVar5;
  char *pcVar6;
  char *this_00;
  console *this_01;
  uint uVar7;
  
  uVar1 = tex->m_width;
  uVar2 = tex->m_height;
  uVar3 = (tex->m_faces).m_size;
  if (uVar3 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = ((tex->m_faces).m_p)->m_size;
  }
  pcVar6 = crnlib::pixel_format_helpers::get_pixel_format_string(tex->m_format);
  this_00 = "%s: %ux%u, Levels: %u, Faces: %u, Format: %s";
  crnlib::console::info
            ("%s: %ux%u, Levels: %u, Faces: %u, Format: %s",pTex_desc,(ulong)uVar1,(ulong)uVar2,
             (ulong)uVar7,(ulong)uVar3,pcVar6);
  crnlib::console::disable_crlf((console *)this_00);
  pcVar6 = crnlib::get_texture_type_desc(params->m_texture_type);
  crnlib::console::info("Apparent type: %s, ",pcVar6);
  crnlib::console::info("Flags: ");
  cVar5 = tex->m_comp_flags;
  if ((cVar5 & cCompFlagRValid) != 0) {
    crnlib::console::info("R ");
    cVar5 = tex->m_comp_flags;
  }
  if ((cVar5 & cCompFlagGValid) != 0) {
    crnlib::console::info("G ");
    cVar5 = tex->m_comp_flags;
  }
  if ((cVar5 & cCompFlagBValid) != 0) {
    crnlib::console::info("B ");
    cVar5 = tex->m_comp_flags;
  }
  if ((cVar5 & cCompFlagAValid) != 0) {
    crnlib::console::info("A ");
    cVar5 = tex->m_comp_flags;
  }
  if ((cVar5 & cCompFlagGrayscale) != 0) {
    crnlib::console::info("Grayscale ");
    cVar5 = tex->m_comp_flags;
  }
  if ((cVar5 & cCompFlagNormalMap) != 0) {
    crnlib::console::info("NormalMap ");
    cVar5 = tex->m_comp_flags;
  }
  if ((cVar5 & cCompFlagLumaChroma) != 0) {
    crnlib::console::info("LumaChroma ");
  }
  bVar4 = crnlib::mipmapped_texture::is_flipped(tex);
  pcVar6 = "Non-Flipped ";
  if (bVar4) {
    pcVar6 = "Flipped ";
  }
  crnlib::console::info(pcVar6);
  this_01 = (console *)0x1a985b;
  crnlib::console::info("\n");
  crnlib::console::enable_crlf(this_01);
  return;
}

Assistant:

void print_texture_info(const char* pTex_desc, texture_conversion::convert_params& params, mipmapped_texture& tex)
    {
        console::info("%s: %ux%u, Levels: %u, Faces: %u, Format: %s",
            pTex_desc,
            tex.get_width(),
            tex.get_height(),
            tex.get_num_levels(),
            tex.get_num_faces(),
            pixel_format_helpers::get_pixel_format_string(tex.get_format()));

        console::disable_crlf();
        console::info("Apparent type: %s, ", get_texture_type_desc(params.m_texture_type));

        console::info("Flags: ");
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagRValid)
        {
            console::info("R ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagGValid)
        {
            console::info("G ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagBValid)
        {
            console::info("B ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagAValid)
        {
            console::info("A ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagGrayscale)
        {
            console::info("Grayscale ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagNormalMap)
        {
            console::info("NormalMap ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagLumaChroma)
        {
            console::info("LumaChroma ");
        }
        if (tex.is_flipped())
        {
            console::info("Flipped ");
        }
        else
        {
            console::info("Non-Flipped ");
        }
        console::info("\n");
        console::enable_crlf();
    }